

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O0

void * hashmap_delete_with_hash(hashmap *map,void *key,uint64_t hash)

{
  int iVar1;
  uint64_t uVar2;
  void *__src;
  bucket *__src_00;
  bucket *prev;
  void *bitem;
  bucket *bucket;
  size_t i;
  uint64_t hash_local;
  void *key_local;
  hashmap *map_local;
  
  uVar2 = clip_hash(hash);
  map->oom = false;
  bucket = (bucket *)(uVar2 & map->mask);
  while( true ) {
    bitem = bucket_at(map,(size_t)bucket);
    if ((ulong)*bitem >> 0x30 == 0) {
      return (void *)0x0;
    }
    __src = bucket_item((bucket *)bitem);
    if ((((ulong)*bitem & 0xffffffffffff) == uVar2) &&
       ((map->compare == (_func_int_void_ptr_void_ptr_void_ptr *)0x0 ||
        (iVar1 = (*map->compare)(key,__src,map->udata), iVar1 == 0)))) break;
    bucket = (bucket *)((ulong)&bucket->field_0x1 & map->mask);
  }
  memcpy(map->spare,__src,map->elsize);
  *(ulong *)bitem = (ulong)*bitem & 0xffffffffffff;
  while( true ) {
    bucket = (bucket *)((ulong)&bucket->field_0x1 & map->mask);
    __src_00 = bucket_at(map,(size_t)bucket);
    if (SUB82(*__src_00,6) < 2) break;
    memcpy(bitem,__src_00,map->bucketsz);
    *(ulong *)bitem = *bitem & 0xffffffffffff | (*bitem >> 0x30) - 1 << 0x30;
    bitem = __src_00;
  }
  *(ulong *)bitem = *bitem & 0xffffffffffff;
  map->count = map->count - 1;
  if ((map->cap < map->nbuckets) && (map->count <= map->shrinkat)) {
    resize(map,map->nbuckets >> 1);
  }
  return map->spare;
}

Assistant:

const void *hashmap_delete_with_hash(struct hashmap *map, const void *key,
    uint64_t hash)
{
    hash = clip_hash(hash);
    map->oom = false;
    size_t i = hash & map->mask;
    while(1) {
        struct bucket *bucket = bucket_at(map, i);
        if (!bucket->dib) {
            return NULL;
        }
        void *bitem = bucket_item(bucket);
        if (bucket->hash == hash && (!map->compare ||
            map->compare(key, bitem, map->udata) == 0))
        {
            memcpy(map->spare, bitem, map->elsize);
            bucket->dib = 0;
            while(1) {
                struct bucket *prev = bucket;
                i = (i + 1) & map->mask;
                bucket = bucket_at(map, i);
                if (bucket->dib <= 1) {
                    prev->dib = 0;
                    break;
                }
                memcpy(prev, bucket, map->bucketsz);
                prev->dib--;
            }
            map->count--;
            if (map->nbuckets > map->cap && map->count <= map->shrinkat) {
                // Ignore the return value. It's ok for the resize operation to
                // fail to allocate enough memory because a shrink operation
                // does not change the integrity of the data.
                resize(map, map->nbuckets/2);
            }
            return map->spare;
        }
        i = (i + 1) & map->mask;
    }
}